

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::restorePreviousSignalHandlers(void)

{
  size_t i;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 6; local_8 = local_8 + 1) {
    sigaction((&signalDefs)[local_8 * 4],(sigaction *)(oldSigActions + local_8 * 0x98),
              (sigaction *)0x0);
  }
  sigaltstack((sigaltstack *)oldSigStack,(sigaltstack *)0x0);
  return;
}

Assistant:

static void restorePreviousSignalHandlers() {
        // We set signal handlers back to the previous ones. Hopefully
        // nobody overwrote them in the meantime, and doesn't expect
        // their signal handlers to live past ours given that they
        // installed them after ours..
        for (std::size_t i = 0; i < sizeof(signalDefs) / sizeof(SignalDefs); ++i) {
            sigaction(signalDefs[i].id, &oldSigActions[i], nullptr);
        }
        // Return the old stack
        sigaltstack(&oldSigStack, nullptr);
    }